

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Exporter::ExportMetadata(glTF2Exporter *this)

{
  element_type *peVar1;
  aiMetadata *paVar2;
  uint *puVar3;
  long *plVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  size_t __n;
  char *pcVar10;
  long lVar11;
  byte bVar12;
  ulong uVar13;
  bool bVar14;
  aiString copyright_str;
  char buffer [256];
  long *local_960;
  ulong local_958;
  long local_950 [2];
  uint local_93c;
  char local_938 [1024];
  char local_538 [264];
  undefined1 local_430 [1024];
  
  peVar1 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::_M_replace
            ((ulong)&(peVar1->asset).version,0,(char *)(peVar1->asset).version._M_string_length,
             0x6b465e);
  uVar5 = aiGetVersionMajor();
  uVar6 = aiGetVersionMinor();
  uVar7 = aiGetVersionRevision();
  snprintf(local_538,0x100,"Open Asset Import Library (assimp v%d.%d.%d)",(ulong)uVar5,(ulong)uVar6,
           (ulong)uVar7);
  pcVar10 = (char *)(peVar1->asset).generator._M_string_length;
  strlen(local_538);
  std::__cxx11::string::_M_replace((ulong)&(peVar1->asset).generator,0,pcVar10,(ulong)local_538);
  local_93c = 0;
  local_938[0] = '\0';
  memset(local_938 + 1,0x1b,0x3ff);
  paVar2 = this->mScene->mMetaData;
  if (paVar2 != (aiMetadata *)0x0) {
    local_960 = local_950;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_960,"SourceAsset_Copyright","")
    ;
    plVar4 = local_960;
    __n = 0x3ff;
    if ((local_958 & 0xfffffc00) == 0) {
      __n = local_958 & 0xffffffff;
    }
    memcpy(local_430,local_960,__n);
    local_430[__n] = 0;
    uVar9 = (ulong)paVar2->mNumProperties;
    if (uVar9 == 0) {
      bVar14 = false;
LAB_003891bf:
      bVar12 = bVar14 & (byte)__n;
    }
    else {
      pcVar10 = paVar2->mKeys->data;
      bVar14 = true;
      uVar13 = 1;
      lVar11 = 0;
      do {
        if ((((aiString *)(pcVar10 + -4))->length == (ai_uint32)__n) &&
           (iVar8 = bcmp(pcVar10,local_430,__n), iVar8 == 0)) {
          if (*(int *)((long)&paVar2->mValues->mType + lVar11) == 5) {
            puVar3 = *(uint **)((long)&paVar2->mValues->mData + lVar11);
            __n = 1;
            if (puVar3 != &local_93c) {
              local_93c = *puVar3;
              uVar9 = (ulong)local_93c;
              memcpy(local_938,puVar3 + 1,uVar9);
              local_938[uVar9] = '\0';
            }
          }
          else {
            __n = 0;
          }
          goto LAB_003891bf;
        }
        bVar14 = uVar13 < uVar9;
        lVar11 = lVar11 + 0x10;
        uVar13 = uVar13 + 1;
        pcVar10 = pcVar10 + 0x404;
      } while (uVar9 << 4 != lVar11);
      bVar12 = 0;
    }
    if (plVar4 != local_950) {
      operator_delete(plVar4,local_950[0] + 1);
    }
    if (bVar12 != 0) {
      pcVar10 = (char *)(peVar1->asset).copyright._M_string_length;
      strlen(local_938);
      std::__cxx11::string::_M_replace((ulong)&peVar1->asset,0,pcVar10,(ulong)local_938);
    }
  }
  return;
}

Assistant:

void glTF2Exporter::ExportMetadata()
{
    AssetMetadata& asset = mAsset->asset;
    asset.version = "2.0";

    char buffer[256];
    ai_snprintf(buffer, 256, "Open Asset Import Library (assimp v%d.%d.%d)",
        aiGetVersionMajor(), aiGetVersionMinor(), aiGetVersionRevision());

    asset.generator = buffer;

    // Copyright
	aiString copyright_str;
	if (mScene->mMetaData != nullptr && mScene->mMetaData->Get(AI_METADATA_SOURCE_COPYRIGHT, copyright_str)) {
        asset.copyright = copyright_str.C_Str();
	}
}